

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O2

void __thiscall Assimp::ASE::Parser::ParseLV2MeshBlock(Parser *this,Mesh *mesh)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  uint uVar4;
  int iVar5;
  uint iIndex;
  uint iNumCFaces;
  uint iNumCVertices;
  uint iNumTFaces;
  uint iNumTVertices;
  uint iNumFaces;
  uint iNumVertices;
  uint local_34;
  
  iNumVertices = 0;
  iNumFaces = 0;
  iNumTVertices = 0;
  iNumTFaces = 0;
  iNumCVertices = 0;
  iNumCFaces = 0;
  iVar5 = 0;
LAB_003e133a:
  do {
    while( true ) {
      pbVar3 = (byte *)this->filePtr;
      bVar1 = *pbVar3;
      if (bVar1 == 0x2a) break;
LAB_003e160c:
      uVar4 = (uint)bVar1;
      if ((uVar4 - 0xc < 2) || (uVar4 == 10)) {
        if (this->bLastWasEndLine != false) goto LAB_003e164e;
        this->iLineNumber = this->iLineNumber + 1;
        bVar2 = true;
      }
      else {
        if (uVar4 == 0x7b) {
          iVar5 = iVar5 + 1;
        }
        else if (uVar4 == 0x7d) {
          iVar5 = iVar5 + -1;
          if (iVar5 == 0) {
            this->filePtr = (char *)(pbVar3 + 1);
            SkipToNextToken(this);
            return;
          }
        }
        else if (uVar4 == 0) {
          LogError(this,"Encountered unexpected EOL while parsing a *MESH chunk (Level 2)");
        }
LAB_003e164e:
        bVar2 = false;
      }
      this->bLastWasEndLine = bVar2;
      this->filePtr = (char *)(pbVar3 + 1);
    }
    this->filePtr = (char *)(pbVar3 + 1);
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMVERTEX",0xe);
    if (bVar2) {
      ParseLV4MeshLong(this,&iNumVertices);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMTVERTEX",0xf);
    if (bVar2) {
      ParseLV4MeshLong(this,&iNumTVertices);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMCVERTEX",0xf);
    if (bVar2) {
      ParseLV4MeshLong(this,&iNumCVertices);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMFACES",0xd);
    if (bVar2) {
      ParseLV4MeshLong(this,&iNumFaces);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMTVFACES",0xf);
    if (bVar2) {
      ParseLV4MeshLong(this,&iNumTFaces);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_NUMCVFACES",0xf);
    if (bVar2) {
      ParseLV4MeshLong(this,&iNumCFaces);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_VERTEX_LIST",0x10);
    if (bVar2) {
      ParseLV3MeshVertexListBlock(this,iNumVertices,mesh);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_FACE_LIST",0xe);
    if (bVar2) {
      ParseLV3MeshFaceListBlock(this,iNumFaces,mesh);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_TVERTLIST",0xe);
    if (bVar2) {
      ParseLV3MeshTListBlock(this,iNumTVertices,mesh,0);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_TFACELIST",0xe);
    if (bVar2) {
      ParseLV3MeshTFaceListBlock(this,iNumTFaces,mesh,0);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_CVERTLIST",0xe);
    if (bVar2) {
      ParseLV3MeshCListBlock(this,iNumCVertices,mesh);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_CFACELIST",0xe);
    if (bVar2) {
      ParseLV3MeshCFaceListBlock(this,iNumCFaces,mesh);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_NORMALS",0xc);
    if (bVar2) {
      ParseLV3MeshNormalListBlock(this,mesh);
      goto LAB_003e133a;
    }
    bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_MAPPINGCHANNEL",0x13);
    if (!bVar2) {
LAB_003e1597:
      bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_ANIMATION",0xe);
      if (bVar2) {
        LogWarning(this,
                   "Found *MESH_ANIMATION element in ASE/ASK file. Keyframe animation is not supported by Assimp, this element will be ignored"
                  );
      }
      else {
        bVar2 = TokenMatch<char_const>(&this->filePtr,"MESH_WEIGHTS",0xc);
        if (!bVar2) {
          pbVar3 = (byte *)this->filePtr;
          bVar1 = *pbVar3;
          goto LAB_003e160c;
        }
        ParseLV3MeshWeightsBlock(this,mesh);
      }
      goto LAB_003e133a;
    }
    iIndex = 0;
    ParseLV4MeshLong(this,&iIndex);
    if (iIndex == 1) {
      local_34 = iIndex;
      LogWarning(this,"Mapping channel has an invalid index. Skipping UV channel");
      SkipSection(this);
      uVar4 = local_34;
    }
    else {
      if (iIndex == 0) {
        LogWarning(this,"Mapping channel has an invalid index. Skipping UV channel");
        SkipSection(this);
        goto LAB_003e1597;
      }
      uVar4 = iIndex;
      if (8 < iIndex) {
        LogWarning(this,"Too many UV channels specified. Skipping channel ..");
        SkipSection(this);
        goto LAB_003e133a;
      }
    }
    ParseLV3MappingChannel(this,uVar4 - 1,mesh);
  } while( true );
}

Assistant:

void Parser::ParseLV2MeshBlock(ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    unsigned int iNumVertices = 0;
    unsigned int iNumFaces = 0;
    unsigned int iNumTVertices = 0;
    unsigned int iNumTFaces = 0;
    unsigned int iNumCVertices = 0;
    unsigned int iNumCFaces = 0;
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            // Number of vertices in the mesh
            if (TokenMatch(filePtr,"MESH_NUMVERTEX" ,14))
            {
                ParseLV4MeshLong(iNumVertices);
                continue;
            }
            // Number of texture coordinates in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumTVertices);
                continue;
            }
            // Number of vertex colors in the mesh
            if (TokenMatch(filePtr,"MESH_NUMCVERTEX" ,15))
            {
                ParseLV4MeshLong(iNumCVertices);
                continue;
            }
            // Number of regular faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMFACES" ,13))
            {
                ParseLV4MeshLong(iNumFaces);
                continue;
            }
            // Number of UVWed faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMTVFACES" ,15))
            {
                ParseLV4MeshLong(iNumTFaces);
                continue;
            }
            // Number of colored faces in the mesh
            if (TokenMatch(filePtr,"MESH_NUMCVFACES" ,15))
            {
                ParseLV4MeshLong(iNumCFaces);
                continue;
            }
            // mesh vertex list block
            if (TokenMatch(filePtr,"MESH_VERTEX_LIST" ,16))
            {
                ParseLV3MeshVertexListBlock(iNumVertices,mesh);
                continue;
            }
            // mesh face list block
            if (TokenMatch(filePtr,"MESH_FACE_LIST" ,14))
            {
                ParseLV3MeshFaceListBlock(iNumFaces,mesh);
                continue;
            }
            // mesh texture vertex list block
            if (TokenMatch(filePtr,"MESH_TVERTLIST" ,14))
            {
                ParseLV3MeshTListBlock(iNumTVertices,mesh);
                continue;
            }
            // mesh texture face block
            if (TokenMatch(filePtr,"MESH_TFACELIST" ,14))
            {
                ParseLV3MeshTFaceListBlock(iNumTFaces,mesh);
                continue;
            }
            // mesh color vertex list block
            if (TokenMatch(filePtr,"MESH_CVERTLIST" ,14))
            {
                ParseLV3MeshCListBlock(iNumCVertices,mesh);
                continue;
            }
            // mesh color face block
            if (TokenMatch(filePtr,"MESH_CFACELIST" ,14))
            {
                ParseLV3MeshCFaceListBlock(iNumCFaces,mesh);
                continue;
            }
            // mesh normals
            if (TokenMatch(filePtr,"MESH_NORMALS" ,12))
            {
                ParseLV3MeshNormalListBlock(mesh);
                continue;
            }
            // another mesh UV channel ...
            if (TokenMatch(filePtr,"MESH_MAPPINGCHANNEL" ,19)) {
                unsigned int iIndex( 0 );
                ParseLV4MeshLong(iIndex);
                if ( 0 == iIndex ) {
                    LogWarning( "Mapping channel has an invalid index. Skipping UV channel" );
                    // skip it ...
                    SkipSection();
                } else {
                    if ( iIndex < 2 ) {
                        LogWarning( "Mapping channel has an invalid index. Skipping UV channel" );
                        // skip it ...
                        SkipSection();
                    }
                    if ( iIndex > AI_MAX_NUMBER_OF_TEXTURECOORDS ) {
                        LogWarning( "Too many UV channels specified. Skipping channel .." );
                        // skip it ...
                        SkipSection();
                    } else {
                        // parse the mapping channel
                        ParseLV3MappingChannel( iIndex - 1, mesh );
                    }
                    continue;
                }
            }
            // mesh animation keyframe. Not supported
            if (TokenMatch(filePtr,"MESH_ANIMATION" ,14))
            {

                LogWarning("Found *MESH_ANIMATION element in ASE/ASK file. "
                    "Keyframe animation is not supported by Assimp, this element "
                    "will be ignored");
                //SkipSection();
                continue;
            }
            if (TokenMatch(filePtr,"MESH_WEIGHTS" ,12))
            {
                ParseLV3MeshWeightsBlock(mesh);continue;
            }
        }
        AI_ASE_HANDLE_SECTION("2","*MESH");
    }
    return;
}